

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::reserveVars(Solver *this,Var v)

{
  int min_cap;
  EVP_PKEY_CTX local_34 [4];
  
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            (&this->watches_bin,local_34);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            (&this->watches_bin,local_34);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            (&this->watches,local_34);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            (&this->watches,local_34);
  min_cap = v + 1;
  vec<Minisat::lbool>::capacity(&this->assigns,min_cap);
  vec<Minisat::Solver::VarData>::capacity(&this->vardata,min_cap);
  vec<unsigned_int>::capacity(&this->oldreasons,min_cap);
  vec<double>::capacity(&this->activity_CHB,min_cap);
  vec<double>::capacity(&this->activity_VSIDS,min_cap);
  vec<double>::capacity(&this->activity_distance,min_cap);
  vec<unsigned_int>::capacity(&this->picked,min_cap);
  vec<unsigned_int>::capacity(&this->conflicted,min_cap);
  vec<unsigned_int>::capacity(&this->almost_conflicted,min_cap);
  vec<unsigned_int>::capacity(&this->canceled,min_cap);
  vec<char>::capacity(&this->seen,min_cap);
  vec<unsigned_long>::capacity(&this->seen2,v * 2 + 1);
  vec<char>::capacity(&this->polarity,min_cap);
  vec<char>::capacity(&this->decision,min_cap);
  vec<Minisat::Lit>::capacity(&this->trail,min_cap);
  vec<Minisat::Lit>::capacity(&this->old_trail,min_cap);
  vec<double>::capacity(&this->var_iLevel,min_cap);
  vec<double>::capacity(&this->var_iLevel_tmp,min_cap);
  vec<int>::capacity(&this->pathCs,min_cap);
  return;
}

Assistant:

void Solver::reserveVars(Var v)
{
    watches_bin.init(mkLit(v, false));
    watches_bin.init(mkLit(v, true));
    watches.init(mkLit(v, false));
    watches.init(mkLit(v, true));
    assigns.capacity(v + 1);
    vardata.capacity(v + 1);
    oldreasons.capacity(v + 1);
    activity_CHB.capacity(v + 1);
    activity_VSIDS.capacity(v + 1);
    activity_distance.capacity(v + 1);

    picked.capacity(v + 1);
    conflicted.capacity(v + 1);
    almost_conflicted.capacity(v + 1);
#ifdef ANTI_EXPLORATION
    canceled.capacity(v + 1);
#endif

    seen.capacity(v + 1);
    seen2.capacity(2 * v + 1);
    polarity.capacity(v + 1);
    decision.capacity(v + 1);
    trail.capacity(v + 1);
    old_trail.capacity(v + 1);

    var_iLevel.capacity(v + 1);
    var_iLevel_tmp.capacity(v + 1);
    pathCs.capacity(v + 1);
}